

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_SHA1_Hash * __thiscall
ON_MeshParameters::GeometrySettingsHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_MeshParameters *this,bool bIgnoreSubDParameters)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  uchar u;
  ON_SubDComponentLocation OVar4;
  undefined7 in_register_00000011;
  double dVar5;
  ON_SHA1 sha1;
  ON_SubDDisplayParameters subd_params;
  ON_SHA1 local_e8;
  ON_SubDDisplayParameters local_68;
  
  if (((int)CONCAT71(in_register_00000011,bIgnoreSubDParameters) != 0) ||
     (bVar3 = ON_SHA1_Hash::IsZeroDigest(&this->m_geometry_settings_hash), bVar3)) {
    local_e8.m_state[2] = 0;
    local_e8.m_state[3] = 0;
    local_e8.m_state[4] = 0;
    local_e8.m_bit_count[0] = 0;
    local_e8.m_bit_count[1] = 0;
    local_e8.m_state[0] = 0;
    local_e8.m_state[1] = 0;
    local_e8.m_buffer[0x30] = '\0';
    local_e8.m_buffer[0x31] = '\0';
    local_e8.m_buffer[0x32] = '\0';
    local_e8.m_buffer[0x33] = '\0';
    local_e8.m_buffer[0x34] = '\0';
    local_e8.m_buffer[0x35] = '\0';
    local_e8.m_buffer[0x36] = '\0';
    local_e8.m_buffer[0x37] = '\0';
    local_e8.m_buffer[0x38] = '\0';
    local_e8.m_buffer[0x39] = '\0';
    local_e8.m_buffer[0x3a] = '\0';
    local_e8.m_buffer[0x3b] = '\0';
    local_e8.m_buffer[0x3c] = '\0';
    local_e8.m_buffer[0x3d] = '\0';
    local_e8.m_buffer[0x3e] = '\0';
    local_e8.m_buffer[0x3f] = '\0';
    local_e8.m_buffer[0x20] = '\0';
    local_e8.m_buffer[0x21] = '\0';
    local_e8.m_buffer[0x22] = '\0';
    local_e8.m_buffer[0x23] = '\0';
    local_e8.m_buffer[0x24] = '\0';
    local_e8.m_buffer[0x25] = '\0';
    local_e8.m_buffer[0x26] = '\0';
    local_e8.m_buffer[0x27] = '\0';
    local_e8.m_buffer[0x28] = '\0';
    local_e8.m_buffer[0x29] = '\0';
    local_e8.m_buffer[0x2a] = '\0';
    local_e8.m_buffer[0x2b] = '\0';
    local_e8.m_buffer[0x2c] = '\0';
    local_e8.m_buffer[0x2d] = '\0';
    local_e8.m_buffer[0x2e] = '\0';
    local_e8.m_buffer[0x2f] = '\0';
    local_e8.m_buffer[0x10] = '\0';
    local_e8.m_buffer[0x11] = '\0';
    local_e8.m_buffer[0x12] = '\0';
    local_e8.m_buffer[0x13] = '\0';
    local_e8.m_buffer[0x14] = '\0';
    local_e8.m_buffer[0x15] = '\0';
    local_e8.m_buffer[0x16] = '\0';
    local_e8.m_buffer[0x17] = '\0';
    local_e8.m_buffer[0x18] = '\0';
    local_e8.m_buffer[0x19] = '\0';
    local_e8.m_buffer[0x1a] = '\0';
    local_e8.m_buffer[0x1b] = '\0';
    local_e8.m_buffer[0x1c] = '\0';
    local_e8.m_buffer[0x1d] = '\0';
    local_e8.m_buffer[0x1e] = '\0';
    local_e8.m_buffer[0x1f] = '\0';
    local_e8.m_buffer[0] = '\0';
    local_e8.m_buffer[1] = '\0';
    local_e8.m_buffer[2] = '\0';
    local_e8.m_buffer[3] = '\0';
    local_e8.m_buffer[4] = '\0';
    local_e8.m_buffer[5] = '\0';
    local_e8.m_buffer[6] = '\0';
    local_e8.m_buffer[7] = '\0';
    local_e8.m_buffer[8] = '\0';
    local_e8.m_buffer[9] = '\0';
    local_e8.m_buffer[10] = '\0';
    local_e8.m_buffer[0xb] = '\0';
    local_e8.m_buffer[0xc] = '\0';
    local_e8.m_buffer[0xd] = '\0';
    local_e8.m_buffer[0xe] = '\0';
    local_e8.m_buffer[0xf] = '\0';
    local_e8.m_byte_count = 0;
    local_e8.m_status_bits = 0;
    local_e8.m_reserved = 0;
    ON_SHA1_Hash::ON_SHA1_Hash(&local_e8.m_sha1_hash);
    ON_SHA1::AccumulateBool(&local_e8,this->m_bSimplePlanes);
    ON_SHA1::AccumulateBool(&local_e8,this->m_bRefine);
    ON_SHA1::AccumulateBool(&local_e8,this->m_bJaggedSeams);
    ON_SHA1::AccumulateUnsigned32(&local_e8,(uint)this->m_mesher);
    dVar1 = this->m_tolerance;
    bVar3 = ON_IsValid(dVar1);
    dVar5 = dVar1;
    if (!bVar3) {
      dVar5 = 0.0;
    }
    ON_SHA1::AccumulateDouble(&local_e8,(double)(-(ulong)(0.0 < dVar1) & (ulong)dVar5));
    dVar1 = this->m_relative_tolerance;
    bVar3 = ON_IsValid(dVar1);
    dVar5 = dVar1;
    if (!bVar3) {
      dVar5 = 0.0;
    }
    ON_SHA1::AccumulateDouble(&local_e8,(double)(-(ulong)(0.0 < dVar1) & (ulong)dVar5));
    dVar1 = this->m_min_edge_length;
    bVar3 = ON_IsValid(dVar1);
    dVar5 = dVar1;
    if (!bVar3) {
      dVar5 = 0.0;
    }
    ON_SHA1::AccumulateDouble(&local_e8,(double)(-(ulong)(0.0 < dVar1) & (ulong)dVar5));
    dVar1 = this->m_max_edge_length;
    bVar3 = ON_IsValid(dVar1);
    dVar5 = dVar1;
    if (!bVar3) {
      dVar5 = 0.0;
    }
    ON_SHA1::AccumulateDouble(&local_e8,(double)(-(ulong)(0.0 < dVar1) & (ulong)dVar5));
    dVar1 = this->m_grid_aspect_ratio;
    bVar3 = ON_IsValid(dVar1);
    dVar5 = dVar1;
    if (!bVar3) {
      dVar5 = 0.0;
    }
    ON_SHA1::AccumulateDouble(&local_e8,(double)(-(ulong)(0.0 < dVar1) & (ulong)dVar5));
    ON_SHA1::AccumulateInteger32(&local_e8,this->m_grid_min_count);
    ON_SHA1::AccumulateInteger32(&local_e8,this->m_grid_max_count);
    dVar1 = this->m_grid_angle_radians;
    bVar3 = ON_IsValid(dVar1);
    dVar5 = dVar1;
    if (!bVar3) {
      dVar5 = 3.141592653589793;
    }
    ON_SHA1::AccumulateDouble
              (&local_e8,
               (double)(~-(ulong)(0.0 < dVar1) & 0x400921fb54442d18 |
                       (ulong)dVar5 & -(ulong)(0.0 < dVar1)));
    dVar1 = this->m_refine_angle_radians;
    bVar3 = ON_IsValid(dVar1);
    dVar5 = dVar1;
    if (!bVar3) {
      dVar5 = 0.0;
    }
    ON_SHA1::AccumulateDouble(&local_e8,(double)(-(ulong)(0.0 < dVar1) & (ulong)dVar5));
    dVar1 = this->m_grid_amplification;
    bVar3 = ON_IsValid(dVar1);
    dVar5 = dVar1;
    if (!bVar3) {
      dVar5 = 1.0;
    }
    ON_SHA1::AccumulateDouble
              (&local_e8,
               (double)(~-(ulong)(0.0 < dVar1) & 0x3ff0000000000000 |
                       (ulong)dVar5 & -(ulong)(0.0 < dVar1)));
    ON_SHA1::AccumulateUnsigned32(&local_e8,(uint)this->m_face_type);
    if (!bIgnoreSubDParameters) {
      ON_SubDDisplayParameters::DecodeFromUnsignedChar
                (&local_68,this->m_subd_mesh_parameters_as_char);
      bVar3 = ON_SubDDisplayParameters::DisplayDensityIsAbsolute(&local_68);
      ON_SHA1::AccumulateBool(&local_e8,bVar3);
      u = ON_SubDDisplayParameters::GetRawDisplayDensityForExperts(&local_68);
      ON_SHA1::AccumulateUnsigned8(&local_e8,u);
      OVar4 = ON_SubDDisplayParameters::MeshLocation(&local_68);
      ON_SHA1::AccumulateBool(&local_e8,OVar4 == ControlNet);
    }
    bVar3 = ON_UuidIsNotNil(&this->m_mesher_id);
    if (bVar3) {
      ON_SHA1::AccumulateId(&local_e8,&this->m_mesher_id);
      Internal_AccumulatePangolinParameters(this,&DefaultMesh,&local_e8);
    }
    if (bIgnoreSubDParameters) {
      ON_SHA1::Hash(__return_storage_ptr__,&local_e8);
      return __return_storage_ptr__;
    }
    ON_SHA1::Hash((ON_SHA1_Hash *)&local_68,&local_e8);
    *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
         (undefined4)local_68.m_reserved6;
    *(undefined8 *)(this->m_geometry_settings_hash).m_digest = local_68._0_8_;
    *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = local_68._8_8_;
  }
  *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) =
       *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10);
  uVar2 = *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8);
  *(undefined8 *)__return_storage_ptr__->m_digest =
       *(undefined8 *)(this->m_geometry_settings_hash).m_digest;
  *(undefined8 *)(__return_storage_ptr__->m_digest + 8) = uVar2;
  return __return_storage_ptr__;
}

Assistant:

ON_SHA1_Hash ON_MeshParameters::GeometrySettingsHash(bool bIgnoreSubDParameters) const
{
  // Please discuss any changes with Dale Lear

  // These values are intentionally ignored.
  //   m_bCustomSettings
  //   m_bCustomSettingsEnabled
  //   m_bComputeCurvature
  //   m_bDoublePrecision
  //   m_bClosedObjectPostProcess
  //   m_texture_range
  //   If they are included here, Rhino will remesh when it should not because it treats
  //   Texture coordinates as a mutable property (const_cast widely used in Rhino).
  //   Curvature is added/removed from analysis mode as needed.
  //   Custom settings controls where the mesh settings come from and when they 
  //   match what was used to create an existing mesh, a remesh is extremely wasteful,
  //   ClosedObjectPostProcess is added/removed as needed and is a hack to cover up core bugs.

  if (bIgnoreSubDParameters || m_geometry_settings_hash.IsZeroDigest())
  {
    ON_SHA1 sha1;
    sha1.AccumulateBool(m_bSimplePlanes);
    sha1.AccumulateBool(m_bRefine);
    sha1.AccumulateBool(m_bJaggedSeams);
    sha1.AccumulateUnsigned32(m_mesher);
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_tolerance,0.0));
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_relative_tolerance,0.0));

    // Do not include m_min_tolerance as a geometry setting.
    // It is a runtime lower bound clamp.
    // If it is included here, Rhino will remesh everytime model tolerance changes.
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_min_edge_length,0.0));
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_max_edge_length,0.0));
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_grid_aspect_ratio,0.0));
    sha1.AccumulateInteger32(m_grid_min_count);
    sha1.AccumulateInteger32(m_grid_max_count);
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_grid_angle_radians,ON_PI));
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_refine_angle_radians,0.0));
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_grid_amplification,1.0));
    sha1.AccumulateUnsigned32(m_face_type);

    if (false == bIgnoreSubDParameters)
    {
      // 2023-05-12, Pierre: Changes in RH-50501 make ON_MeshParameters::SetComputeCurvature also
      // act on the SubD mesh parameters, and I believe this is good (keeping the compute curvature bit
      // in sync between Brep meshing parameters and SubD mesh parameters). This means Breps with
      // compute curvature on also have non-default SubD meshing parameters (they always have the SubD
      // parameters, they just used to be default).
      // These values are intentionally ignored:
      //   m_reserved
      //   m_context
      //   m_bComputeCurvature
      //   m_reserved3
      //   m_reserved4
      //   m_reserved5
      //   m_reserved6
      //   m_reserved7
      //   m_terminator
      //   m_progress_reporter
      //   m_progress_reporter_interval
      ON_SubDDisplayParameters subd_params{
          ON_SubDDisplayParameters::DecodeFromUnsignedChar(m_subd_mesh_parameters_as_char)};
      sha1.AccumulateBool(subd_params.DisplayDensityIsAbsolute());
      sha1.AccumulateUnsigned8((ON__UINT8)subd_params.GetRawDisplayDensityForExperts());  // display density fits in a char
      sha1.AccumulateBool(subd_params.MeshLocation() == ON_SubDComponentLocation::ControlNet);
    }

    if (ON_UuidIsNotNil(m_mesher_id))
    {
      // The Pangolin parameters and any other, parameters we add in the future,
      // contribute to the SHA1 only when they differ from default values.
      // This keeps old SHA-1 values correct and prevents remeshing when openning
      // old files.
      sha1.AccumulateId(m_mesher_id);

      // Pangolin parameters
      Internal_AccumulatePangolinParameters(ON_MeshParameters::DefaultMesh, sha1);
    }
    
    if (bIgnoreSubDParameters)
      return sha1.Hash();

    m_geometry_settings_hash = sha1.Hash();
  }
  return m_geometry_settings_hash;
}